

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O1

bool __thiscall
IRT::ConditionalJumpPattern::TryToGenerateCode
          (ConditionalJumpPattern *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TLogicOperator TVar3;
  CJumpConditionalStatement *this_00;
  CExpression *pCVar4;
  CTempExpression *this_01;
  CTempExpression *this_02;
  INode *pIVar5;
  CLabelStatement *pCVar6;
  CTemp rightOperand;
  CTemp leftOperand;
  undefined1 local_d9;
  shared_ptr<AssemblyCode::CJumpEqualCommand> local_d8;
  CLabel local_c8;
  INode *local_a8;
  pair<IRT::CTemp,_const_IRT::INode_*> local_a0;
  CTemp local_78;
  CTemp local_58;
  vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
  *local_38;
  
  if (tree == (INode *)0x0) {
    this_00 = (CJumpConditionalStatement *)0x0;
  }
  else {
    this_00 = (CJumpConditionalStatement *)
              __dynamic_cast(tree,&INode::typeinfo,&CJumpConditionalStatement::typeinfo,0);
  }
  if (this_00 != (CJumpConditionalStatement *)0x0) {
    CTemp::CTemp(&local_58);
    CTemp::CTemp(&local_78);
    pCVar4 = CJumpConditionalStatement::LeftOperand(this_00);
    if (pCVar4 == (CExpression *)0x0) {
      this_01 = (CTempExpression *)0x0;
    }
    else {
      this_01 = (CTempExpression *)
                __dynamic_cast(pCVar4,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
    }
    pCVar4 = CJumpConditionalStatement::RightOperand(this_00);
    if (pCVar4 == (CExpression *)0x0) {
      this_02 = (CTempExpression *)0x0;
    }
    else {
      this_02 = (CTempExpression *)
                __dynamic_cast(pCVar4,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
    }
    if (this_01 == (CTempExpression *)0x0) {
      local_38 = (vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)commands;
      pIVar5 = (INode *)CJumpConditionalStatement::LeftOperand(this_00);
      paVar1 = &local_c8.label.field_2;
      local_c8.label._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,local_58.name._M_dataplus._M_p,
                 local_58.name._M_dataplus._M_p + local_58.name._M_string_length);
      paVar2 = &local_a0.first.name.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.label._M_dataplus._M_p == paVar1) {
        local_a0.first.name.field_2._8_8_ = local_c8.label.field_2._8_8_;
        local_a0.first.name._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_a0.first.name._M_dataplus._M_p = local_c8.label._M_dataplus._M_p;
      }
      local_a0.first.name.field_2._M_allocated_capacity._1_7_ =
           local_c8.label.field_2._M_allocated_capacity._1_7_;
      local_a0.first.name.field_2._M_local_buf[0] = local_c8.label.field_2._M_local_buf[0];
      local_a0.first.name._M_string_length = local_c8.label._M_string_length;
      local_c8.label._M_string_length = 0;
      local_c8.label.field_2._M_local_buf[0] = '\0';
      local_c8.label._M_dataplus._M_p = (pointer)paVar1;
      local_a8 = pIVar5;
      local_a0.second = pIVar5;
      std::
      vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
      ::emplace_back<std::pair<IRT::CTemp,IRT::INode_const*>>
                ((vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
                  *)children,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.first.name._M_dataplus._M_p != paVar2) {
        operator_delete(local_a0.first.name._M_dataplus._M_p);
      }
      commands = (AssemblyCommands *)local_38;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.label._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8.label._M_dataplus._M_p);
        commands = (AssemblyCommands *)local_38;
      }
    }
    else {
      CTempExpression::getTemprorary(this_01);
      std::__cxx11::string::_M_assign((string *)&local_58);
    }
    if (this_02 == (CTempExpression *)0x0) {
      pIVar5 = (INode *)CJumpConditionalStatement::RightOperand(this_00);
      paVar1 = &local_c8.label.field_2;
      local_c8.label._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,local_78.name._M_dataplus._M_p,
                 local_78.name._M_dataplus._M_p + local_78.name._M_string_length);
      paVar2 = &local_a0.first.name.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.label._M_dataplus._M_p == paVar1) {
        local_a0.first.name.field_2._8_8_ = local_c8.label.field_2._8_8_;
        local_a0.first.name._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_a0.first.name._M_dataplus._M_p = local_c8.label._M_dataplus._M_p;
      }
      local_a0.first.name.field_2._M_allocated_capacity._1_7_ =
           local_c8.label.field_2._M_allocated_capacity._1_7_;
      local_a0.first.name.field_2._M_local_buf[0] = local_c8.label.field_2._M_local_buf[0];
      local_a0.first.name._M_string_length = local_c8.label._M_string_length;
      local_c8.label._M_string_length = 0;
      local_c8.label.field_2._M_local_buf[0] = '\0';
      local_c8.label._M_dataplus._M_p = (pointer)paVar1;
      local_a8 = pIVar5;
      local_a0.second = pIVar5;
      std::
      vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
      ::emplace_back<std::pair<IRT::CTemp,IRT::INode_const*>>
                ((vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
                  *)children,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.first.name._M_dataplus._M_p != paVar2) {
        operator_delete(local_a0.first.name._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.label._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8.label._M_dataplus._M_p);
      }
    }
    else {
      CTempExpression::getTemprorary(this_02);
      std::__cxx11::string::_M_assign((string *)&local_78);
    }
    TVar3 = CJumpConditionalStatement::Operation(this_00);
    switch(TVar3) {
    case EQUALS:
      pCVar6 = CJumpConditionalStatement::TrueLabel(this_00);
      CLabelStatement::Label(&local_c8,pCVar6);
      CLabel::ToString_abi_cxx11_((string *)&local_a0,&local_c8);
      local_d8.super___shared_ptr<AssemblyCode::CJumpEqualCommand,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<AssemblyCode::CJumpEqualCommand,std::allocator<AssemblyCode::CJumpEqualCommand>,IRT::CTemp&,IRT::CTemp&,std::__cxx11::string>
                (&local_d8.
                  super___shared_ptr<AssemblyCode::CJumpEqualCommand,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(CJumpEqualCommand **)&local_d8,
                 (allocator<AssemblyCode::CJumpEqualCommand> *)&local_d9,&local_58,&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::CJumpEqualCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)commands,&local_d8);
      break;
    case NOT_EQUALS:
      pCVar6 = CJumpConditionalStatement::TrueLabel(this_00);
      CLabelStatement::Label(&local_c8,pCVar6);
      CLabel::ToString_abi_cxx11_((string *)&local_a0,&local_c8);
      local_d8.super___shared_ptr<AssemblyCode::CJumpEqualCommand,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<AssemblyCode::CJumpNotEqualCommand,std::allocator<AssemblyCode::CJumpNotEqualCommand>,IRT::CTemp&,IRT::CTemp&,std::__cxx11::string>
                (&local_d8.
                  super___shared_ptr<AssemblyCode::CJumpEqualCommand,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(CJumpNotEqualCommand **)&local_d8,
                 (allocator<AssemblyCode::CJumpNotEqualCommand> *)&local_d9,&local_58,&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::CJumpNotEqualCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)commands,(shared_ptr<AssemblyCode::CJumpNotEqualCommand> *)&local_d8);
      break;
    case LESS:
      pCVar6 = CJumpConditionalStatement::TrueLabel(this_00);
      CLabelStatement::Label(&local_c8,pCVar6);
      CLabel::ToString_abi_cxx11_((string *)&local_a0,&local_c8);
      local_d8.super___shared_ptr<AssemblyCode::CJumpEqualCommand,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<AssemblyCode::CJumpLessCommand,std::allocator<AssemblyCode::CJumpLessCommand>,IRT::CTemp&,IRT::CTemp&,std::__cxx11::string>
                (&local_d8.
                  super___shared_ptr<AssemblyCode::CJumpEqualCommand,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(CJumpLessCommand **)&local_d8,
                 (allocator<AssemblyCode::CJumpLessCommand> *)&local_d9,&local_58,&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::CJumpLessCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)commands,(shared_ptr<AssemblyCode::CJumpLessCommand> *)&local_d8);
      break;
    case GREATER:
      pCVar6 = CJumpConditionalStatement::TrueLabel(this_00);
      CLabelStatement::Label(&local_c8,pCVar6);
      CLabel::ToString_abi_cxx11_((string *)&local_a0,&local_c8);
      local_d8.super___shared_ptr<AssemblyCode::CJumpEqualCommand,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<AssemblyCode::CJumpLessCommand,std::allocator<AssemblyCode::CJumpLessCommand>,IRT::CTemp&,IRT::CTemp&,std::__cxx11::string>
                (&local_d8.
                  super___shared_ptr<AssemblyCode::CJumpEqualCommand,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(CJumpLessCommand **)&local_d8,
                 (allocator<AssemblyCode::CJumpLessCommand> *)&local_d9,&local_78,&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::CJumpLessCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)commands,(shared_ptr<AssemblyCode::CJumpLessCommand> *)&local_d8);
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/utils/TreePatterns.cpp"
                    ,0x146,
                    "virtual bool IRT::ConditionalJumpPattern::TryToGenerateCode(const IRT::INode *, const IRT::CTemp &, ChildrenTemps &, AssemblyCommands &)"
                   );
    }
    if (local_d8.super___shared_ptr<AssemblyCode::CJumpEqualCommand,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d8.
                 super___shared_ptr<AssemblyCode::CJumpEqualCommand,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.first.name._M_dataplus._M_p != &local_a0.first.name.field_2) {
      operator_delete(local_a0.first.name._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.label._M_dataplus._M_p != &local_c8.label.field_2) {
      operator_delete(local_c8.label._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.name._M_dataplus._M_p != &local_78.name.field_2) {
      operator_delete(local_78.name._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.name._M_dataplus._M_p != &local_58.name.field_2) {
      operator_delete(local_58.name._M_dataplus._M_p);
    }
  }
  return this_00 != (CJumpConditionalStatement *)0x0;
}

Assistant:

bool
IRT::ConditionalJumpPattern::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest, ChildrenTemps &children,
                                                AssemblyCommands &commands ) {
    ConstCJumpPtr cJumpPtr = dynamic_cast<ConstCJumpPtr>(tree);
    if ( cJumpPtr ) {
        CTemp leftOperand;
        CTemp rightOperand;
        ConstTempPtr leftTemp = dynamic_cast<ConstTempPtr>(cJumpPtr->LeftOperand( ));
        ConstTempPtr rightTemp = dynamic_cast<ConstTempPtr>(cJumpPtr->RightOperand( ));
        if ( !leftTemp ) {
            children.push_back( std::make_pair( leftOperand, cJumpPtr->LeftOperand( )));
        } else {
            leftOperand = leftTemp->getTemprorary( );
        }
        if ( !rightTemp ) {
            children.push_back( std::make_pair( rightOperand, cJumpPtr->RightOperand( )));
        } else {
            rightOperand = rightTemp->getTemprorary( );
        }
        switch ( cJumpPtr->Operation( )) {
            case IRT::enums::TLogicOperator::LESS : {
                commands.emplace_back( std::make_shared<AssemblyCode::CJumpLessCommand>( leftOperand, rightOperand,
                                                                                         cJumpPtr->TrueLabel( )->Label( ).ToString( )));
                break;
            }
            case IRT::enums::TLogicOperator::GREATER : {
                commands.emplace_back( std::make_shared<AssemblyCode::CJumpLessCommand>( rightOperand, leftOperand,
                                                                                         cJumpPtr->TrueLabel( )->Label( ).ToString( )));
                break;
            }
            case IRT::enums::TLogicOperator::EQUALS : {
                commands.emplace_back( std::make_shared<AssemblyCode::CJumpEqualCommand>( leftOperand, rightOperand,
                                                                                          cJumpPtr->TrueLabel( )->Label( ).ToString( )));
                break;
            }
            case IRT::enums::TLogicOperator::NOT_EQUALS : {
                commands.emplace_back( std::make_shared<AssemblyCode::CJumpNotEqualCommand>( leftOperand, rightOperand,
                                                                                             cJumpPtr->TrueLabel( )->Label( ).ToString( )));
                break;
            }
            default: {
                assert( false );
            }
        }
        return true;
    }
    return false;
}